

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

option_results * __thiscall argagg::parser_results::operator[](parser_results *this,string *name)

{
  iterator iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  undefined1 auVar3 [12];
  ostringstream msg;
  string local_1b0 [32];
  ostream local_190;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->options)._M_h,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_true>
      ._M_cur != (__node_type *)0x0) {
    return (option_results *)
           ((long)iVar1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argagg::option_results>,_true>
                  ._M_cur + 0x28);
  }
  auVar3 = std::__throw_out_of_range("_Map_base::at");
  if (auVar3._8_4_ == 1) {
    __cxa_begin_catch(auVar3._0_8_);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"no option named \"",0x11);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (&local_190,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" in parser_results",0x13);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,local_1b0);
    *(undefined ***)this_00 = &PTR__runtime_error_001236d8;
    __cxa_throw(this_00,&unknown_option::typeinfo,std::runtime_error::~runtime_error);
  }
  _Unwind_Resume(auVar3._0_8_);
}

Assistant:

inline
option_results& parser_results::operator [] (const std::string& name)
try {
  return this->options.at(name);
} catch (const std::out_of_range& e) {
  std::ostringstream msg;
  msg << "no option named \"" << name << "\" in parser_results";
  throw unknown_option(msg.str());
}